

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_16_bit(char *filename)

{
  FILE *__stream;
  int result;
  FILE *f;
  char *filename_local;
  
  __stream = (FILE *)stbi__fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    filename_local._4_4_ = stbi__err("can\'t fopen");
  }
  else {
    filename_local._4_4_ = stbi_is_16_bit_from_file((FILE *)__stream);
    fclose(__stream);
  }
  return filename_local._4_4_;
}

Assistant:

STBIDEF int stbi_is_16_bit(char const *filename)
{
    FILE *f = stbi__fopen(filename, "rb");
    int result;
    if (!f) return stbi__err("can't fopen", "Unable to open file");
    result = stbi_is_16_bit_from_file(f);
    fclose(f);
    return result;
}